

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall ctemplate::Template::~Template(Template *this)

{
  HtmlParser *pHVar1;
  pointer pcVar2;
  
  this->_vptr_Template = (_func_int **)&PTR__Template_0014d1d8;
  num_deletes_ = num_deletes_ + 1;
  if (this->tree_ != (SectionTemplateNode *)0x0) {
    (*(this->tree_->super_TemplateNode)._vptr_TemplateNode[1])();
  }
  if (this->template_text_ != (char *)0x0) {
    operator_delete__(this->template_text_);
  }
  pHVar1 = this->htmlparser_;
  if (pHVar1 != (HtmlParser *)0x0) {
    ctemplate_htmlparser::htmlparser_delete(pHVar1->parser_);
  }
  operator_delete(pHVar1);
  pcVar2 = (this->resolved_filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->resolved_filename_).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->original_filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->original_filename_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Template::~Template() {
  VLOG(2) << endl << "Deleting Template for " << template_file()
          << "; with context " << initial_context_
          << "; and strip " << strip_ << endl;
  // Since this is only used by tests, we don't bother with locking
  num_deletes_++;
  delete tree_;
  // Delete this last, since tree has pointers into template_text_
  delete[] template_text_;
  delete htmlparser_;
}